

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.cpp
# Opt level: O2

void __thiscall EthernetLink::onCollision(EthernetLink *this,Event *e)

{
  pointer ppEVar1;
  
  this->_isCollision = false;
  this->_isBusy = false;
  this->_isContending = false;
  ppEVar1 = (this->_contending).
            super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while ((this->_contending).
         super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
         super__Vector_impl_data._M_start != ppEVar1) {
    (*(ppEVar1[-1]->super_NetInterface).super_Entity._vptr_Entity[8])();
    ppEVar1 = (this->_contending).
              super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    (this->_contending).
    super__Vector_base<EthernetInterface_*,_std::allocator<EthernetInterface_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppEVar1;
  }
  this->_message = (Message *)0x0;
  return;
}

Assistant:

void EthernetLink::onCollision(Event *e)
{
    DBGENTER(_ETHLINK_DBG);

    _isContending = false;
    _isCollision = false;
    _isBusy = false;
    while (!_contending.empty()) {
	_contending.back()->onCollision();
	_contending.pop_back();
    }
    _message = 0;        
}